

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

void __thiscall wasm::TableFill::finalize(TableFill *this)

{
  ulong uVar1;
  
  uVar1 = 1;
  if (((this->dest->type).id != 1) && ((this->value->type).id != 1)) {
    uVar1 = (ulong)((this->size->type).id == 1);
  }
  (this->super_SpecificExpression<(wasm::Expression::Id)49>).super_Expression.type.id = uVar1;
  return;
}

Assistant:

void TableFill::finalize() {
  if (dest->type == Type::unreachable || value->type == Type::unreachable ||
      size->type == Type::unreachable) {
    type = Type::unreachable;
  } else {
    type = Type::none;
  }
}